

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VCCluster::delItem(VCCluster *this,VCFace *f)

{
  bool bVar1;
  long in_RSI;
  const_iterator in_RDI;
  iterator it;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_ffffffffffffff88;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_stack_ffffffffffffff90;
  _Base_ptr this_00;
  Scalar *in_stack_ffffffffffffffa0;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_ffffffffffffffa8;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_ffffffffffffffb0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffffb8;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::find
                 (in_RDI._M_node,(key_type *)in_stack_ffffffffffffff90);
  local_20._M_node =
       (_Base_ptr)
       std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::end
                 ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                  in_stack_ffffffffffffff88);
  bVar1 = std::operator!=(&local_18,&local_20);
  if (bVar1) {
    std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>::erase_abi_cxx11_
              (in_stack_ffffffffffffff90,in_RDI);
    in_RDI._M_node[2]._M_right =
         (_Base_ptr)((double)in_RDI._M_node[2]._M_right - *(double *)(local_10 + 0x120));
    this_00 = in_RDI._M_node + 2;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_ffffffffffffffb8,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_ffffffffffffffb0);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,in_stack_ffffffffffffff88);
    *(undefined8 *)(local_10 + 0x140) = 0;
    Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator-=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    (**(code **)(*(long *)in_RDI._M_node + 8))(in_RDI._M_node,local_10);
  }
  return;
}

Assistant:

void VCCluster::delItem(VCFace* f) {
	auto it = items.find(f);
	if (it != items.end()) {
		items.erase(it);
		area -= f->area;
		weightedSum = weightedSum - f->center * f->area;
		f->cluster = NULL;
		E -= f->E;
		delItemAdditionalAct(f);
	}
}